

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  AsyncCapabilityStream *pAVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> writeBuffer;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_50;
  
  if (__n == 0) {
    kj::_::readyNow();
  }
  else {
    pAVar1 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
    if (pAVar1 == (AsyncCapabilityStream *)0x0) {
      pvVar2 = operator_new(0x400);
      *(undefined8 *)((long)pvVar2 + 0x1d8) = 0;
      *(undefined8 *)((long)pvVar2 + 0x1e0) = 0;
      *(undefined ***)((long)pvVar2 + 0x1d0) = &PTR_destroy_006224e0;
      *(undefined ***)((long)pvVar2 + 0x1e8) = &PTR_reject_00622530;
      *(undefined1 *)((long)pvVar2 + 0x1f0) = 0;
      *(undefined1 *)((long)pvVar2 + 0x388) = 0;
      *(undefined1 *)((long)pvVar2 + 0x390) = 1;
      local_50.tag = 0;
      writeBuffer.size_ = __n;
      writeBuffer.ptr = (uchar *)__buf;
      BlockedWrite::BlockedWrite
                ((BlockedWrite *)((long)pvVar2 + 0x398),
                 (PromiseFulfiller<void> *)((long)pvVar2 + 0x1e8),
                 (AsyncPipe *)CONCAT44(in_register_00000034,__fd),writeBuffer,
                 (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>)ZEXT816(0),&local_50);
      OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
      ::destroy(&local_50);
      *(void **)((long)pvVar2 + 0x1d8) = pvVar2;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)((long)pvVar2 + 0x1d0);
    }
    else {
      (**(pAVar1->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream)
                (this,&(pAVar1->super_AsyncIoStream).super_AsyncOutputStream,__buf,__n);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) {
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.write(buffer);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, buffer, nullptr);
    }
  }